

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O1

CURLcode tool_setopt(CURL *curl,_Bool str,GlobalConfig *config,char *name,CURLoption tag,...)

{
  bool bVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  size_t len;
  char *pcVar5;
  slist_wc **plist;
  NameValue *pNVar6;
  bool bVar7;
  bool bVar8;
  va_list arg;
  char buf [256];
  char *local_1c0;
  char local_138 [264];
  
  if (tag < 10000) {
    pcVar4 = "CURLOPT_SSL_VERIFYPEER";
    pNVar6 = setopt_nv_CURLNONZERODEFAULTS;
    pcVar5 = (char *)0x0;
    do {
      pNVar6 = pNVar6 + 1;
      iVar2 = strcmp(name,pcVar4);
      if (iVar2 == 0) {
        pcVar5 = (char *)pNVar6[-1].value;
        break;
      }
      pcVar4 = pNVar6->name;
    } while (pcVar4 != (char *)0x0);
    curl_msnprintf(local_138,0x100,"%ldL",local_1c0);
    len = (size_t)tag;
    CVar3 = curl_easy_setopt(curl,len,local_1c0);
    bVar7 = local_1c0 == pcVar5;
LAB_0011a8e1:
    bVar1 = false;
    local_1c0 = local_138;
    bVar8 = false;
  }
  else {
    if (29999 < tag) {
      curl_msnprintf(local_138,0x100,"(curl_off_t)%ld",local_1c0);
      len = (size_t)tag;
      CVar3 = curl_easy_setopt(curl,len,local_1c0);
      bVar7 = local_1c0 == (char *)0x0;
      goto LAB_0011a8e1;
    }
    bVar7 = local_1c0 == (char *)0x0;
    if (tag < 20000) {
      if (local_1c0 == (char *)0x0 || !str) {
        pcVar4 = "objectpointer";
        goto LAB_0011a903;
      }
      bVar1 = true;
      bVar7 = false;
      bVar8 = false;
    }
    else {
      pcVar4 = "functionpointer";
LAB_0011a903:
      bVar8 = local_1c0 != (char *)0x0;
      if (!bVar8) {
        pcVar4 = local_1c0;
      }
      local_1c0 = pcVar4;
      bVar1 = false;
    }
    len = (size_t)tag;
    CVar3 = curl_easy_setopt(curl);
  }
  pcVar4 = (char *)0x0;
  if (((config->libcurl == (char *)0x0) || (bVar7)) || (CVar3 != CURLE_OK)) goto LAB_0011a9a8;
  if (bVar8) {
    plist = &easysrc_toohard;
    pcVar5 = "%s set to a %s";
LAB_0011a996:
    pcVar4 = (char *)0x0;
  }
  else {
    if (!bVar1) {
      plist = &easysrc_code;
      pcVar5 = "curl_easy_setopt(hnd, %s, %s);";
      goto LAB_0011a996;
    }
    local_1c0 = c_escape(local_1c0,len);
    if (local_1c0 == (char *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
      pcVar4 = (char *)0x0;
      goto LAB_0011a9a8;
    }
    plist = &easysrc_code;
    pcVar5 = "curl_easy_setopt(hnd, %s, \"%s\");";
    pcVar4 = local_1c0;
  }
  CVar3 = easysrc_addf(plist,pcVar5,name,local_1c0);
LAB_0011a9a8:
  free(pcVar4);
  return CVar3;
}

Assistant:

CURLcode tool_setopt(CURL *curl, bool str, struct GlobalConfig *config,
                     const char *name, CURLoption tag, ...)
{
  va_list arg;
  char buf[256];
  const char *value = NULL;
  bool remark = FALSE;
  bool skip = FALSE;
  bool escape = FALSE;
  char *escaped = NULL;
  CURLcode ret = CURLE_OK;

  va_start(arg, tag);

  if(tag < CURLOPTTYPE_OBJECTPOINT) {
    /* Value is expected to be a long */
    long lval = va_arg(arg, long);
    long defval = 0L;
    const NameValue *nv = NULL;
    for(nv = setopt_nv_CURLNONZERODEFAULTS; nv->name; nv++) {
      if(!strcmp(name, nv->name)) {
        defval = nv->value;
        break; /* found it */
      }
    }

    msnprintf(buf, sizeof(buf), "%ldL", lval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, lval);
    if(lval == defval)
      skip = TRUE;
  }
  else if(tag < CURLOPTTYPE_OFF_T) {
    /* Value is some sort of object pointer */
    void *pval = va_arg(arg, void *);

    /* function pointers are never printable */
    if(tag >= CURLOPTTYPE_FUNCTIONPOINT) {
      if(pval) {
        value = "functionpointer";
        remark = TRUE;
      }
      else
        skip = TRUE;
    }

    else if(pval && str) {
      value = (char *)pval;
      escape = TRUE;
    }
    else if(pval) {
      value = "objectpointer";
      remark = TRUE;
    }
    else
      skip = TRUE;

    ret = curl_easy_setopt(curl, tag, pval);

  }
  else {
    /* Value is expected to be curl_off_t */
    curl_off_t oval = va_arg(arg, curl_off_t);
    msnprintf(buf, sizeof(buf),
              "(curl_off_t)%" CURL_FORMAT_CURL_OFF_T, oval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, oval);

    if(!oval)
      skip = TRUE;
  }

  va_end(arg);

  if(config->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */

    if(remark)
      REM2("%s set to a %s", name, value);
    else {
      if(escape) {
        escaped = c_escape(value, CURL_ZERO_TERMINATED);
        NULL_CHECK(escaped);
        CODE2("curl_easy_setopt(hnd, %s, \"%s\");", name, escaped);
      }
      else
        CODE2("curl_easy_setopt(hnd, %s, %s);", name, value);
    }
  }

 nomem:
  Curl_safefree(escaped);
  return ret;
}